

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O3

bool __thiscall LowererMD::Simd128TryLowerMappedInstruction(LowererMD *this,Instr *instr)

{
  OpCode OVar1;
  OpCode OVar2;
  Func *pFVar3;
  code *pcVar4;
  OpndKind OVar5;
  bool bVar6;
  byte bVar7;
  undefined4 *puVar8;
  intptr_t pMemLoc;
  MemRefOpnd *this_00;
  Opnd *pOVar9;
  
  OVar1 = this->m_simd128OpCodesMap[*(int *)&instr->m_opcode - 0x299U & 0xffff];
  if (OVar1 == EndOfBlock) goto LAB_0066b62f;
  OVar5 = IR::Opnd::GetKind(instr->m_dst);
  pOVar9 = instr->m_dst;
  if (OVar5 == OpndKindReg) {
    bVar6 = IRType_IsSimd128(pOVar9->m_type);
    if (!bVar6) {
      pOVar9 = instr->m_dst;
      goto LAB_0066af7c;
    }
  }
  else {
LAB_0066af7c:
    if (pOVar9->m_type != TyInt32) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x38,
                         "(instr->GetDst() && instr->GetDst()->IsRegOpnd() && instr->GetDst()->IsSimd128() || instr->GetDst()->GetType() == TyInt32)"
                         ,
                         "instr->GetDst() && instr->GetDst()->IsRegOpnd() && instr->GetDst()->IsSimd128() || instr->GetDst()->GetType() == TyInt32"
                        );
      if (!bVar6) goto LAB_0066b6b3;
      *puVar8 = 0;
    }
  }
  if (((instr->m_src1 == (Opnd *)0x0) ||
      (OVar5 = IR::Opnd::GetKind(instr->m_src1), OVar5 != OpndKindReg)) ||
     (bVar6 = IRType_IsSimd128(instr->m_src1->m_type), !bVar6)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x39,
                       "(instr->GetSrc1() && instr->GetSrc1()->IsRegOpnd() && instr->GetSrc1()->IsSimd128())"
                       ,
                       "instr->GetSrc1() && instr->GetSrc1()->IsRegOpnd() && instr->GetSrc1()->IsSimd128()"
                      );
    if (!bVar6) goto LAB_0066b6b3;
    *puVar8 = 0;
  }
  if (((instr->m_src2 != (Opnd *)0x0) &&
      ((OVar5 = IR::Opnd::GetKind(instr->m_src2), OVar5 != OpndKindReg ||
       (bVar6 = IRType_IsSimd128(instr->m_src2->m_type), !bVar6)))) &&
     ((OVar5 = IR::Opnd::GetKind(instr->m_src2), OVar5 != OpndKindIntConst ||
      (instr->m_src2->m_type != TyInt8)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x3a,
                       "(!instr->GetSrc2() || (((instr->GetSrc2()->IsRegOpnd() && instr->GetSrc2()->IsSimd128()) || (instr->GetSrc2()->IsIntConstOpnd() && instr->GetSrc2()->GetType() == TyInt8))))"
                       ,
                       "!instr->GetSrc2() || (((instr->GetSrc2()->IsRegOpnd() && instr->GetSrc2()->IsSimd128()) || (instr->GetSrc2()->IsIntConstOpnd() && instr->GetSrc2()->GetType() == TyInt8)))"
                      );
    if (!bVar6) goto LAB_0066b6b3;
    *puVar8 = 0;
  }
  OVar2 = instr->m_opcode;
  if (OVar2 < Simd128_Lt_I16) {
    if (Simd128_LtEq_D2 < OVar2) {
      if (OVar2 - 0x2de < 2) goto LAB_0066b3d3;
      if (OVar2 == Simd128_Neg_D2) {
        if (OVar1 != XORPS) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar8 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                             ,0x4b,"(opcode == Js::OpCode::XORPS)","opcode == Js::OpCode::XORPS");
          if (!bVar6) goto LAB_0066b6b3;
          *puVar8 = 0;
        }
        pMemLoc = ThreadContextInfo::GetX86NegMaskD2Addr(this->m_func->m_threadContextInfo);
      }
      else {
        if (OVar2 != Simd128_Abs_D2) goto LAB_0066b620;
        if (OVar1 != ANDPD) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar8 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                             ,0x43,"(opcode == Js::OpCode::ANDPD)","opcode == Js::OpCode::ANDPD");
          if (!bVar6) goto LAB_0066b6b3;
          *puVar8 = 0;
        }
        pMemLoc = ThreadContextInfo::GetX86AbsMaskD2Addr(this->m_func->m_threadContextInfo);
      }
      goto LAB_0066b3b2;
    }
    if (Simd128_Abs_F4 < OVar2) {
      if (1 < OVar2 - 0x2c7) {
        if (OVar2 == Simd128_Neg_F4) {
          if (OVar1 != XORPS) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar8 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                               ,0x47,"(opcode == Js::OpCode::XORPS)","opcode == Js::OpCode::XORPS");
            if (!bVar6) goto LAB_0066b6b3;
            *puVar8 = 0;
          }
          pMemLoc = ThreadContextInfo::GetX86NegMaskF4Addr(this->m_func->m_threadContextInfo);
          goto LAB_0066b3b2;
        }
        goto LAB_0066b620;
      }
LAB_0066b3d3:
      if ((3 < OVar1 - 0x3f9) && (2 < OVar1 - 0x461)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                           ,100,
                           "(opcode == Js::OpCode::CMPLTPS || opcode == Js::OpCode::CMPLTPD || opcode == Js::OpCode::CMPLEPS || opcode == Js::OpCode::CMPLEPD || opcode == Js::OpCode::PCMPGTD || opcode == Js::OpCode::PCMPGTB || opcode == Js::OpCode::PCMPGTW)"
                           ,
                           "opcode == Js::OpCode::CMPLTPS || opcode == Js::OpCode::CMPLTPD || opcode == Js::OpCode::CMPLEPS || opcode == Js::OpCode::CMPLEPD || opcode == Js::OpCode::PCMPGTD || opcode == Js::OpCode::PCMPGTB || opcode == Js::OpCode::PCMPGTW"
                          );
        if (!bVar6) goto LAB_0066b6b3;
        *puVar8 = 0;
      }
      this_00 = (MemRefOpnd *)IR::Instr::UnlinkSrc1(instr);
      pOVar9 = IR::Instr::UnlinkSrc2(instr);
      if (instr->m_src1 != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
        if (!bVar6) goto LAB_0066b6b3;
        *puVar8 = 0;
      }
      pFVar3 = instr->m_func;
      if (pOVar9->isDeleted == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x14,"(!isDeleted)","Using deleted operand");
        if (!bVar6) goto LAB_0066b6b3;
        *puVar8 = 0;
      }
      bVar7 = pOVar9->field_0xb;
      if ((bVar7 & 2) != 0) {
        pOVar9 = IR::Opnd::Copy(pOVar9,pFVar3);
        bVar7 = pOVar9->field_0xb;
      }
      pOVar9->field_0xb = bVar7 | 2;
      instr->m_src1 = pOVar9;
      goto LAB_0066b540;
    }
    if (OVar2 == Simd128_Lt_I4) goto LAB_0066b3d3;
    if (OVar2 == Simd128_Not_I4) goto LAB_0066b345;
    if (OVar2 == Simd128_Abs_F4) {
      if (OVar1 != ANDPS) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                           ,0x3f,"(opcode == Js::OpCode::ANDPS)","opcode == Js::OpCode::ANDPS");
        if (!bVar6) goto LAB_0066b6b3;
        *puVar8 = 0;
      }
      pMemLoc = ThreadContextInfo::GetX86AbsMaskF4Addr(this->m_func->m_threadContextInfo);
      goto LAB_0066b3b2;
    }
  }
  else {
    if (OVar2 < Simd128_Not_U4) {
      if (OVar2 < Simd128_Not_B16) {
        if (OVar2 != Simd128_Lt_I16) {
          if (OVar2 != Simd128_Not_I16) goto LAB_0066b620;
          goto LAB_0066b345;
        }
      }
      else {
        if ((OVar2 == Simd128_Not_B16) || (OVar2 == Simd128_Not_I8)) goto LAB_0066b345;
        if (OVar2 != Simd128_Lt_I8) goto LAB_0066b620;
      }
      goto LAB_0066b3d3;
    }
    if (((0x2a < OVar2 - 0x3a0) || ((0x40100000001U >> ((ulong)(OVar2 - 0x3a0) & 0x3f) & 1) == 0))
       && ((OVar2 != Simd128_Not_U4 && (OVar2 != Simd128_Not_U8)))) goto LAB_0066b620;
LAB_0066b345:
    if (OVar1 != XORPS) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x57,"(opcode == Js::OpCode::XORPS)","opcode == Js::OpCode::XORPS");
      if (!bVar6) goto LAB_0066b6b3;
      *puVar8 = 0;
    }
    pMemLoc = ThreadContextInfo::GetX86AllNegOnesAddr(this->m_func->m_threadContextInfo);
LAB_0066b3b2:
    this_00 = IR::MemRefOpnd::New(pMemLoc,instr->m_src1->m_type,this->m_func,AddrOpndKindDynamicMisc
                                 );
LAB_0066b540:
    if (instr->m_src2 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
      if (!bVar6) goto LAB_0066b6b3;
      *puVar8 = 0;
    }
    pFVar3 = instr->m_func;
    if ((this_00->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar6) {
LAB_0066b6b3:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar8 = 0;
    }
    bVar7 = (this_00->super_Opnd).field_0xb;
    if ((bVar7 & 2) != 0) {
      this_00 = (MemRefOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,pFVar3);
      bVar7 = (this_00->super_Opnd).field_0xb;
    }
    (this_00->super_Opnd).field_0xb = bVar7 | 2;
    instr->m_src2 = &this_00->super_Opnd;
  }
LAB_0066b620:
  instr->m_opcode = OVar1;
  Legalize<false>(instr,false);
LAB_0066b62f:
  return OVar1 != EndOfBlock;
}

Assistant:

bool LowererMD::Simd128TryLowerMappedInstruction(IR::Instr *instr)
{
    bool legalize = true;
    Js::OpCode opcode = GET_SIMDOPCODE(instr->m_opcode);

    if ((uint32)opcode == 0)
        return false;

    Assert(instr->GetDst() && instr->GetDst()->IsRegOpnd() && instr->GetDst()->IsSimd128() || instr->GetDst()->GetType() == TyInt32);
    Assert(instr->GetSrc1() && instr->GetSrc1()->IsRegOpnd() && instr->GetSrc1()->IsSimd128());
    Assert(!instr->GetSrc2() || (((instr->GetSrc2()->IsRegOpnd() && instr->GetSrc2()->IsSimd128()) || (instr->GetSrc2()->IsIntConstOpnd() && instr->GetSrc2()->GetType() == TyInt8))));

    switch (instr->m_opcode)
    {
    case Js::OpCode::Simd128_Abs_F4:
        Assert(opcode == Js::OpCode::ANDPS);
        instr->SetSrc2(IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86AbsMaskF4Addr(), instr->GetSrc1()->GetType(), m_func));
        break;
    case Js::OpCode::Simd128_Abs_D2:
        Assert(opcode == Js::OpCode::ANDPD);
        instr->SetSrc2(IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86AbsMaskD2Addr(), instr->GetSrc1()->GetType(), m_func));
        break;
    case Js::OpCode::Simd128_Neg_F4:
        Assert(opcode == Js::OpCode::XORPS);
        instr->SetSrc2(IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86NegMaskF4Addr(), instr->GetSrc1()->GetType(), m_func));
        break;
    case Js::OpCode::Simd128_Neg_D2:
        Assert(opcode == Js::OpCode::XORPS);
        instr->SetSrc2(IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86NegMaskD2Addr(), instr->GetSrc1()->GetType(), m_func));
        break;
    case Js::OpCode::Simd128_Not_I4:
    case Js::OpCode::Simd128_Not_I16:
    case Js::OpCode::Simd128_Not_I8:
    case Js::OpCode::Simd128_Not_U4:
    case Js::OpCode::Simd128_Not_U8:
    case Js::OpCode::Simd128_Not_U16:
    case Js::OpCode::Simd128_Not_B4:
    case Js::OpCode::Simd128_Not_B8:
    case Js::OpCode::Simd128_Not_B16:
        Assert(opcode == Js::OpCode::XORPS);
        instr->SetSrc2(IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86AllNegOnesAddr(), instr->GetSrc1()->GetType(), m_func));
        break;
    case Js::OpCode::Simd128_Gt_F4:
    case Js::OpCode::Simd128_Gt_D2:
    case Js::OpCode::Simd128_GtEq_F4:
    case Js::OpCode::Simd128_GtEq_D2:
    case Js::OpCode::Simd128_Lt_I4:
    case Js::OpCode::Simd128_Lt_I8:
    case Js::OpCode::Simd128_Lt_I16:
    {
        Assert(opcode == Js::OpCode::CMPLTPS || opcode == Js::OpCode::CMPLTPD || opcode == Js::OpCode::CMPLEPS
            || opcode == Js::OpCode::CMPLEPD || opcode == Js::OpCode::PCMPGTD || opcode == Js::OpCode::PCMPGTB
            || opcode == Js::OpCode::PCMPGTW );
        // swap operands
        auto *src1 = instr->UnlinkSrc1();
        auto *src2 = instr->UnlinkSrc2();
        instr->SetSrc1(src2);
        instr->SetSrc2(src1);
        break;
    }

    }
    instr->m_opcode = opcode;
    if (legalize)
    {
        //MakeDstEquSrc1(instr);
        Legalize(instr);
    }

    return true;
}